

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

void fasttext::utils::initLog(void)

{
  int iVar1;
  double dVar2;
  real x;
  int i;
  
  if (t_log == (void *)0x0) {
    t_log = operator_new__(0x804);
    for (iVar1 = 0; iVar1 < 0x201; iVar1 = iVar1 + 1) {
      dVar2 = std::log((double)(ulong)(uint)(((float)iVar1 + 1e-05) / 512.0));
      *(int *)((long)t_log + (long)iVar1 * 4) = SUB84(dVar2,0);
    }
  }
  return;
}

Assistant:

void initLog() {
    if (t_log != nullptr) return;
    t_log = new real[LOG_TABLE_SIZE + 1];
    for (int i = 0; i < LOG_TABLE_SIZE + 1; i++) {
      real x = (real(i) + 1e-5) / LOG_TABLE_SIZE;
      t_log[i] = std::log(x);
    }
  }